

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

directory_iterator * __thiscall
ghc::filesystem::directory_iterator::operator++(directory_iterator *this)

{
  bool bVar1;
  undefined8 uVar2;
  directory_iterator *in_RDI;
  path *in_stack_00000020;
  string *in_stack_00000028;
  filesystem_error *in_stack_00000030;
  error_code in_stack_00000038;
  error_code ec;
  int in_stack_000001dc;
  error_code *in_stack_ffffffffffffff90;
  error_code *in_stack_ffffffffffffffa8;
  impl *in_stack_ffffffffffffffb0;
  error_code local_18;
  
  std::error_code::error_code(in_stack_ffffffffffffff90);
  std::
  __shared_ptr_access<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1de057);
  impl::increment(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  bVar1 = std::error_code::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    return in_RDI;
  }
  uVar2 = __cxa_allocate_exception(0x90);
  std::error_code::value(&local_18);
  detail::systemErrorText<int>(in_stack_000001dc);
  std::
  __shared_ptr_access<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1de0ad);
  filesystem_error::filesystem_error
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000038);
  __cxa_throw(uVar2,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE directory_iterator& directory_iterator::operator++()
{
    std::error_code ec;
    _impl->increment(ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), _impl->_dir_entry._path, ec);
    }
    return *this;
}